

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

rrb<immutable::vector<char,_false,_6>,_true,_5> *
immutable::rrb_details::rrb_head_clone<immutable::vector<char,false,6>,true,5>
          (rrb<immutable::vector<char,_false,_6>,_true,_5> *original)

{
  atomic<unsigned_int> *paVar1;
  tree_node<immutable::vector<char,_false,_6>,_true> *ptVar2;
  leaf_node<immutable::vector<char,_false,_6>,_true> *plVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  rrb<immutable::vector<char,_false,_6>,_true,_5> *prVar8;
  
  prVar8 = (rrb<immutable::vector<char,_false,_6>,_true,_5> *)malloc(0x28);
  uVar4 = original->cnt;
  uVar5 = original->shift;
  uVar6 = original->tail_len;
  uVar7 = *(undefined4 *)&original->field_0xc;
  ptVar2 = (original->root).ptr;
  (prVar8->tail).ptr = (original->tail).ptr;
  (prVar8->root).ptr = ptVar2;
  prVar8->cnt = uVar4;
  prVar8->shift = uVar5;
  prVar8->tail_len = uVar6;
  *(undefined4 *)&prVar8->field_0xc = uVar7;
  uVar7 = *(undefined4 *)&original->field_0x24;
  prVar8->_ref_count =
       (__atomic_base<unsigned_int>)(original->_ref_count).super___atomic_base<unsigned_int>;
  *(undefined4 *)&prVar8->field_0x24 = uVar7;
  ptVar2 = (prVar8->root).ptr;
  if (ptVar2 != (tree_node<immutable::vector<char,_false,_6>,_true> *)0x0) {
    LOCK();
    paVar1 = &ptVar2->_ref_count;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  plVar3 = (prVar8->tail).ptr;
  if (plVar3 != (leaf_node<immutable::vector<char,_false,_6>,_true> *)0x0) {
    LOCK();
    paVar1 = &plVar3->_ref_count;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  return prVar8;
}

Assistant:

inline rrb<T, atomic_ref_counting, N>* rrb_head_clone(const rrb<T, atomic_ref_counting, N>* original)
      {
      rrb<T, atomic_ref_counting, N>* clone = (rrb<T, atomic_ref_counting, N>*)malloc(sizeof(rrb<T, atomic_ref_counting, N>));
      memcpy(clone, original, sizeof(rrb<T, atomic_ref_counting, N>));
      clone->root.inc();
      clone->tail.inc();
      return clone;
      }